

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWritePla.c
# Opt level: O0

int Io_WriteMoPlaOneM(FILE *pFile,Abc_Ntk_t *pNtk,int nMints)

{
  int iVar1;
  int iVar2;
  DdManager *pDVar3;
  Vec_Ptr_t *p;
  Abc_Obj_t *pAVar4;
  void *Entry;
  DdNode *pDVar5;
  DdNode *pDVar6;
  DdNode *bFunc_1;
  int i;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vFuncsGlob;
  DdNode *bFunc;
  DdManager *dd;
  int fVerbose;
  int nMints_local;
  Abc_Ntk_t *pNtk_local;
  FILE *pFile_local;
  
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 == 0) {
    iVar1 = Abc_NtkIsBddLogic(pNtk);
    if (iVar1 != 0) {
      pAVar4 = Abc_NtkCo(pNtk,0);
      pAVar4 = Abc_ObjFanin0(pAVar4);
      pDVar5 = (DdNode *)(pAVar4->field_5).pData;
      pDVar3 = (DdManager *)pNtk->pManFunc;
      iVar1 = pDVar3->size;
      iVar2 = Abc_NtkCiNum(pNtk);
      if (iVar1 == iVar2) {
        Io_WriteMoPlaOneIntMintermsM(pFile,pNtk,pDVar3,pDVar5,nMints);
      }
      else {
        printf(
              "Cannot write minterms because the size of the manager for local BDDs is not equal to\n"
              );
        printf(
              "the number of primary inputs. (It is likely that the current network is not collapsed.)\n"
              );
      }
    }
  }
  else {
    iVar1 = Abc_NtkIsStrash(pNtk);
    if (iVar1 == 0) {
      __assert_fail("Abc_NtkIsStrash(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWritePla.c"
                    ,0x202,"int Io_WriteMoPlaOneM(FILE *, Abc_Ntk_t *, int)");
    }
    pDVar3 = (DdManager *)Abc_NtkBuildGlobalBdds(pNtk,10000000,1,1,0,0);
    if (pDVar3 == (DdManager *)0x0) {
      return 0;
    }
    iVar1 = Abc_NtkCoNum(pNtk);
    p = Vec_PtrAlloc(iVar1);
    for (bFunc_1._4_4_ = 0; iVar1 = Abc_NtkCoNum(pNtk), bFunc_1._4_4_ < iVar1;
        bFunc_1._4_4_ = bFunc_1._4_4_ + 1) {
      pAVar4 = Abc_NtkCo(pNtk,bFunc_1._4_4_);
      Entry = Abc_ObjGlobalBdd(pAVar4);
      Vec_PtrPush(p,Entry);
    }
    pDVar5 = (DdNode *)Vec_PtrEntry(p,0);
    pDVar6 = Cudd_ReadOne(pDVar3);
    if (pDVar5 == pDVar6) {
      printf("First primary output has constant 1 function.\n");
    }
    else {
      pDVar6 = Cudd_ReadOne(pDVar3);
      if ((DdNode *)((ulong)pDVar5 ^ 1) == pDVar6) {
        printf("First primary output has constant 0 function.\n");
      }
      else {
        Io_WriteMoPlaOneIntMintermsM(pFile,pNtk,pDVar3,pDVar5,nMints);
      }
    }
    Abc_NtkFreeGlobalBdds(pNtk,0);
    for (bFunc_1._4_4_ = 0; iVar1 = Vec_PtrSize(p), bFunc_1._4_4_ < iVar1;
        bFunc_1._4_4_ = bFunc_1._4_4_ + 1) {
      pDVar5 = (DdNode *)Vec_PtrEntry(p,bFunc_1._4_4_);
      Cudd_RecursiveDeref(pDVar3,pDVar5);
    }
    Vec_PtrFree(p);
    Cudd_Quit(pDVar3);
  }
  return 1;
}

Assistant:

int Io_WriteMoPlaOneM( FILE * pFile, Abc_Ntk_t * pNtk, int nMints )
{
    int fVerbose = 0;
    DdManager * dd;
    DdNode * bFunc;
    Vec_Ptr_t * vFuncsGlob;
    Abc_Obj_t * pObj;
    int i;
    if ( Abc_NtkIsStrash(pNtk) )
    {
        assert( Abc_NtkIsStrash(pNtk) );
        dd = (DdManager *)Abc_NtkBuildGlobalBdds( pNtk, 10000000, 1, 1, 0, fVerbose );
        if ( dd == NULL )
            return 0;
        if ( fVerbose )
            printf( "Shared BDD size = %6d nodes.\n", Cudd_ReadKeys(dd) - Cudd_ReadDead(dd) );

        // complement the global functions
        vFuncsGlob = Vec_PtrAlloc( Abc_NtkCoNum(pNtk) );
        Abc_NtkForEachCo( pNtk, pObj, i )
            Vec_PtrPush( vFuncsGlob, Abc_ObjGlobalBdd(pObj) );

        // get the output function
        bFunc = (DdNode *)Vec_PtrEntry(vFuncsGlob, 0);
        if ( bFunc == Cudd_ReadOne(dd) )
            printf( "First primary output has constant 1 function.\n" );
        else if ( Cudd_Not(bFunc) == Cudd_ReadOne(dd) )
            printf( "First primary output has constant 0 function.\n" );
        else
            Io_WriteMoPlaOneIntMintermsM( pFile, pNtk, dd, bFunc, nMints );
        Abc_NtkFreeGlobalBdds( pNtk, 0 );

        // cleanup
        Vec_PtrForEachEntry( DdNode *, vFuncsGlob, bFunc, i )
            Cudd_RecursiveDeref( dd, bFunc );
        Vec_PtrFree( vFuncsGlob );
        //Extra_StopManager( dd );
        Cudd_Quit( dd );
    }
    else if ( Abc_NtkIsBddLogic(pNtk) )
    {
        DdNode * bFunc = (DdNode *)Abc_ObjFanin0(Abc_NtkCo(pNtk, 0))->pData;
        dd = (DdManager *)pNtk->pManFunc;
        if ( dd->size == Abc_NtkCiNum(pNtk) )
            Io_WriteMoPlaOneIntMintermsM( pFile, pNtk, dd, bFunc, nMints );
        else
        {
            printf( "Cannot write minterms because the size of the manager for local BDDs is not equal to\n" );
            printf( "the number of primary inputs. (It is likely that the current network is not collapsed.)\n" );
        }
    }
    return 1;
}